

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.h
# Opt level: O2

void __thiscall
Assimp::RAWImporter::MeshInformation::MeshInformation(MeshInformation *this,string *_name)

{
  std::__cxx11::string::string((string *)this,(string *)_name);
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&this->vertices,100);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(&this->colors,100);
  return;
}

Assistant:

explicit MeshInformation(const std::string& _name)
            : name(_name)
        {
            vertices.reserve(100);
            colors.reserve(100);
        }